

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_avx2.c
# Opt level: O3

void aom_lpf_horizontal_8_quad_avx2(uchar *s,int p,uchar *_blimit0,uchar *_limit0,uchar *_thresh0)

{
  uchar uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  long lVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [32];
  undefined8 local_78;
  undefined8 uStack_70;
  
  uVar1 = *_limit0;
  auVar25[1] = uVar1;
  auVar25[0] = uVar1;
  auVar25[2] = uVar1;
  auVar25[3] = uVar1;
  auVar25[4] = uVar1;
  auVar25[5] = uVar1;
  auVar25[6] = uVar1;
  auVar25[7] = uVar1;
  auVar25[8] = uVar1;
  auVar25[9] = uVar1;
  auVar25[10] = uVar1;
  auVar25[0xb] = uVar1;
  auVar25[0xc] = uVar1;
  auVar25[0xd] = uVar1;
  auVar25[0xe] = uVar1;
  auVar25[0xf] = uVar1;
  uVar1 = *_blimit0;
  auVar28[1] = uVar1;
  auVar28[0] = uVar1;
  auVar28[2] = uVar1;
  auVar28[3] = uVar1;
  auVar28[4] = uVar1;
  auVar28[5] = uVar1;
  auVar28[6] = uVar1;
  auVar28[7] = uVar1;
  auVar28[8] = uVar1;
  auVar28[9] = uVar1;
  auVar28[10] = uVar1;
  auVar28[0xb] = uVar1;
  auVar28[0xc] = uVar1;
  auVar28[0xd] = uVar1;
  auVar28[0xe] = uVar1;
  auVar28[0xf] = uVar1;
  auVar2 = *(undefined1 (*) [16])(s + -(long)(p * 4));
  auVar16._16_16_ = auVar2;
  auVar16._0_16_ = auVar2;
  lVar14 = (long)p;
  auVar3 = *(undefined1 (*) [16])(s + lVar14 * -3);
  auVar15._16_16_ = auVar3;
  auVar15._0_16_ = auVar3;
  auVar4 = *(undefined1 (*) [16])(s + lVar14 * -2);
  auVar20._16_16_ = auVar4;
  auVar20._0_16_ = auVar4;
  auVar5 = *(undefined1 (*) [16])(s + -lVar14);
  auVar21._16_16_ = auVar5;
  auVar21._0_16_ = auVar5;
  auVar6 = *(undefined1 (*) [16])s;
  auVar23._16_16_ = auVar6;
  auVar23._0_16_ = auVar6;
  auVar7 = *(undefined1 (*) [16])(s + lVar14);
  auVar24._16_16_ = auVar7;
  auVar24._0_16_ = auVar7;
  auVar8 = *(undefined1 (*) [16])(s + lVar14 * 2);
  auVar22._16_16_ = auVar8;
  auVar22._0_16_ = auVar8;
  auVar9 = *(undefined1 (*) [16])(s + lVar14 * 3);
  auVar19._16_16_ = auVar9;
  auVar19._0_16_ = auVar9;
  auVar10 = vpsubusb_avx(auVar4,auVar5);
  auVar26 = vpsubusb_avx(auVar5,auVar4);
  auVar10 = vpor_avx(auVar10,auVar26);
  auVar26 = vpsubusb_avx(auVar7,auVar6);
  auVar11 = vpsubusb_avx(auVar6,auVar7);
  auVar26 = vpor_avx(auVar26,auVar11);
  auVar11 = vpmaxub_avx(auVar10,auVar26);
  auVar10 = vpsubusb_avx(auVar5,auVar6);
  auVar26 = vpsubusb_avx(auVar6,auVar5);
  auVar10 = vpor_avx(auVar10,auVar26);
  auVar26 = vpsubusb_avx(auVar4,auVar7);
  auVar29 = vpsubusb_avx(auVar7,auVar4);
  auVar26 = vpor_avx(auVar26,auVar29);
  auVar10 = vpaddusb_avx(auVar10,auVar10);
  auVar29[8] = 0x7f;
  auVar29._0_8_ = 0x7f7f7f7f7f7f7f7f;
  auVar29[9] = 0x7f;
  auVar29[10] = 0x7f;
  auVar29[0xb] = 0x7f;
  auVar29[0xc] = 0x7f;
  auVar29[0xd] = 0x7f;
  auVar29[0xe] = 0x7f;
  auVar29[0xf] = 0x7f;
  auVar26 = vpsrlw_avx(auVar26,1);
  auVar26 = vpand_avx(auVar26,auVar29);
  auVar10 = vpaddusb_avx(auVar10,auVar26);
  auVar26 = vpminub_avx(auVar10,auVar28);
  auVar26 = vpcmpeqb_avx(auVar10,auVar26);
  auVar10 = vpcmpeqd_avx(auVar10,auVar10);
  auVar10 = vpmaxub_avx(auVar11,auVar26 ^ auVar10);
  auVar26 = vpsubusb_avx(auVar3,auVar4);
  auVar29 = vpsubusb_avx(auVar4,auVar3);
  auVar26 = vpor_avx(auVar26,auVar29);
  auVar29 = vpsubusb_avx(auVar2,auVar3);
  auVar28 = vpsubusb_avx(auVar3,auVar2);
  auVar29 = vpor_avx(auVar29,auVar28);
  auVar26 = vpmaxub_avx(auVar26,auVar29);
  auVar10 = vpmaxub_avx(auVar26,auVar10);
  auVar26 = vpsubusb_avx(auVar8,auVar7);
  auVar29 = vpsubusb_avx(auVar7,auVar8);
  auVar26 = vpor_avx(auVar26,auVar29);
  auVar29 = vpsubusb_avx(auVar9,auVar8);
  auVar28 = vpsubusb_avx(auVar8,auVar9);
  auVar29 = vpor_avx(auVar29,auVar28);
  auVar26 = vpmaxub_avx(auVar26,auVar29);
  auVar10 = vpmaxub_avx(auVar26,auVar10);
  auVar26 = vpminub_avx(auVar10,auVar25);
  auVar10 = vpcmpeqb_avx(auVar10,auVar26);
  if ((((((((((((((((auVar10 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar10 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar10 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar10 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar10 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar10 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar10 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar10 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar10 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar10 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar10 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar10 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar10 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
       (auVar10 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar10 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar10[0xf] < '\0') {
    uVar1 = *_thresh0;
    auVar26[1] = uVar1;
    auVar26[0] = uVar1;
    auVar26[2] = uVar1;
    auVar26[3] = uVar1;
    auVar26[4] = uVar1;
    auVar26[5] = uVar1;
    auVar26[6] = uVar1;
    auVar26[7] = uVar1;
    auVar26[8] = uVar1;
    auVar26[9] = uVar1;
    auVar26[10] = uVar1;
    auVar26[0xb] = uVar1;
    auVar26[0xc] = uVar1;
    auVar26[0xd] = uVar1;
    auVar26[0xe] = uVar1;
    auVar26[0xf] = uVar1;
    auVar26 = vpminub_avx(auVar11,auVar26);
    auVar27[8] = 0x80;
    auVar27._0_8_ = 0x8080808080808080;
    auVar27[9] = 0x80;
    auVar27[10] = 0x80;
    auVar27[0xb] = 0x80;
    auVar27[0xc] = 0x80;
    auVar27[0xd] = 0x80;
    auVar27[0xe] = 0x80;
    auVar27[0xf] = 0x80;
    auVar25 = vpcmpeqb_avx(auVar11,auVar26);
    auVar26 = vpsubsb_avx(auVar27 ^ auVar4,auVar27 ^ auVar7);
    auVar29 = vpsubsb_avx(auVar27 ^ auVar6,auVar27 ^ auVar5);
    auVar26 = vpandn_avx(auVar25,auVar26);
    auVar26 = vpaddsb_avx(auVar26,auVar29);
    auVar26 = vpaddsb_avx(auVar26,auVar29);
    auVar26 = vpaddsb_avx(auVar26,auVar29);
    auVar29 = vpand_avx(auVar10,auVar26);
    auVar30[8] = 4;
    auVar30._0_8_ = 0x404040404040404;
    auVar30[9] = 4;
    auVar30[10] = 4;
    auVar30[0xb] = 4;
    auVar30[0xc] = 4;
    auVar30[0xd] = 4;
    auVar30[0xe] = 4;
    auVar30[0xf] = 4;
    auVar17[8] = 3;
    auVar17._0_8_ = 0x303030303030303;
    auVar17[9] = 3;
    auVar17[10] = 3;
    auVar17[0xb] = 3;
    auVar17[0xc] = 3;
    auVar17[0xd] = 3;
    auVar17[0xe] = 3;
    auVar17[0xf] = 3;
    auVar26 = vpaddsb_avx(auVar30,auVar29);
    auVar29 = vpaddsb_avx(auVar29,auVar17);
    auVar28 = vpcmpgtb_avx((undefined1  [16])0x0,auVar26);
    auVar26 = vpsrlw_avx(auVar26,3);
    auVar31._8_8_ = 0x1f1f1f1f1f1f1f1f;
    auVar31._0_8_ = 0x1f1f1f1f1f1f1f1f;
    auVar26 = vpand_avx(auVar26,auVar31);
    auVar28 = vpandn_avx(auVar31,auVar28);
    auVar17 = vpor_avx(auVar26,auVar28);
    auVar30 = vpsubsb_avx(auVar27 ^ auVar6,auVar17);
    auVar28 = vpcmpgtb_avx((undefined1  [16])0x0,auVar29);
    auVar26 = vpsrlw_avx(auVar29,3);
    auVar26 = vpand_avx(auVar31,auVar26);
    auVar29 = vpandn_avx(auVar31,auVar28);
    auVar26 = vpor_avx(auVar26,auVar29);
    auVar26 = vpaddsb_avx(auVar27 ^ auVar5,auVar26);
    auVar18[8] = 1;
    auVar18._0_8_ = 0x101010101010101;
    auVar18[9] = 1;
    auVar18[10] = 1;
    auVar18[0xb] = 1;
    auVar18[0xc] = 1;
    auVar18[0xd] = 1;
    auVar18[0xe] = 1;
    auVar18[0xf] = 1;
    auVar29 = vpaddsb_avx(auVar17,auVar18);
    auVar28 = vpsrlw_avx(auVar29,1);
    auVar32._8_8_ = 0x7f7f7f7f7f7f7f7f;
    auVar32._0_8_ = 0x7f7f7f7f7f7f7f7f;
    auVar28 = vpand_avx(auVar28,auVar32);
    auVar29 = vpandn_avx(auVar32,auVar29);
    auVar29 = vpor_avx(auVar28,auVar29);
    auVar33._8_8_ = 0x8080808080808080;
    auVar33._0_8_ = 0x8080808080808080;
    auVar29 = vpand_avx(auVar25,auVar29);
    auVar4 = vpaddsb_avx(auVar27 ^ auVar4,auVar29);
    auVar28 = vpsubsb_avx(auVar27 ^ auVar7,auVar29);
    auVar28 = auVar33 ^ auVar28;
    auVar7 = vpsubusb_avx(auVar3,auVar5);
    auVar29 = vpsubusb_avx(auVar5,auVar3);
    auVar7 = vpor_avx(auVar7,auVar29);
    auVar29 = vpsubusb_avx(auVar8,auVar6);
    auVar25 = vpsubusb_avx(auVar6,auVar8);
    auVar29 = vpor_avx(auVar25,auVar29);
    auVar7 = vpmaxub_avx(auVar7,auVar29);
    auVar7 = vpmaxub_avx(auVar11,auVar7);
    auVar11 = vpsubusb_avx(auVar2,auVar5);
    auVar2 = vpsubusb_avx(auVar5,auVar2);
    auVar2 = vpor_avx(auVar2,auVar11);
    auVar5 = vpsubusb_avx(auVar9,auVar6);
    auVar6 = vpsubusb_avx(auVar6,auVar9);
    auVar5 = vpor_avx(auVar5,auVar6);
    auVar2 = vpmaxub_avx(auVar5,auVar2);
    auVar2 = vpmaxub_avx(auVar2,auVar7);
    auVar5 = vpminub_avx(auVar2,auVar18);
    auVar2 = vpcmpeqb_avx(auVar2,auVar5);
    auVar2 = vpand_avx(auVar10,auVar2);
    if ((((((((((((((((auVar2 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar2 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar2 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar2 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar2 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar2 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar2 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar2 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar2 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar2 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar2 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar2 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar2 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar2 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar2 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar2[0xf] < '\0') {
      auVar12 = vpshufb_avx2(auVar15,_DAT_0051e8c0);
      auVar13 = vpshufb_avx2(auVar20,_DAT_0051e8c0);
      auVar21 = vpshufb_avx2(auVar21,_DAT_0051e8c0);
      auVar23 = vpshufb_avx2(auVar23,_DAT_0051e8c0);
      auVar24 = vpshufb_avx2(auVar24,_DAT_0051e8c0);
      auVar15 = vpaddw_avx2(auVar21,auVar23);
      auVar15 = vpaddw_avx2(auVar15,auVar24);
      auVar20 = vpaddw_avx2(auVar12,auVar13);
      auVar15 = vpaddw_avx2(auVar20,auVar15);
      auVar20 = vpshufb_avx2(auVar22,_DAT_0051e8c0);
      auVar34._8_2_ = 4;
      auVar34._0_8_ = 0x4000400040004;
      auVar34._10_2_ = 4;
      auVar34._12_2_ = 4;
      auVar34._14_2_ = 4;
      auVar34._16_2_ = 4;
      auVar34._18_2_ = 4;
      auVar34._20_2_ = 4;
      auVar34._22_2_ = 4;
      auVar34._24_2_ = 4;
      auVar34._26_2_ = 4;
      auVar34._28_2_ = 4;
      auVar34._30_2_ = 4;
      auVar22 = vpaddw_avx2(auVar34,auVar20);
      auVar15 = vpaddw_avx2(auVar22,auVar15);
      auVar34 = vpshufb_avx2(auVar16,_DAT_0051e8c0);
      auVar22 = vpaddw_avx2(auVar15,auVar34);
      auVar16 = vpaddw_avx2(auVar22,auVar21);
      auVar16 = vpsrlw_avx2(auVar16,3);
      auVar5 = vpackuswb_avx(auVar16._0_16_,auVar16._16_16_);
      auVar6 = vpblendvb_avx(auVar33 ^ auVar26,auVar5,auVar2);
      auVar19 = vpshufb_avx2(auVar19,_DAT_0051e8c0);
      auVar15 = vpaddw_avx2(auVar15,auVar19);
      auVar16 = vpaddw_avx2(auVar15,auVar23);
      auVar16 = vpsrlw_avx2(auVar16,3);
      auVar5 = vpackuswb_avx(auVar16._0_16_,auVar16._16_16_);
      auVar7 = vpblendvb_avx(auVar30 ^ auVar33,auVar5,auVar2);
      auVar16 = vpsubw_avx2(auVar34,auVar20);
      auVar22 = vpaddw_avx2(auVar22,auVar16);
      auVar16 = vpaddw_avx2(auVar22,auVar13);
      auVar16 = vpsrlw_avx2(auVar16,3);
      auVar5 = vpackuswb_avx(auVar16._0_16_,auVar16._16_16_);
      auVar5 = vpblendvb_avx(auVar33 ^ auVar4,auVar5,auVar2);
      auVar16 = vpsubw_avx2(auVar19,auVar12);
      auVar15 = vpaddw_avx2(auVar16,auVar15);
      auVar16 = vpaddw_avx2(auVar15,auVar24);
      auVar16 = vpsrlw_avx2(auVar16,3);
      auVar4 = vpackuswb_avx(auVar16._0_16_,auVar16._16_16_);
      auVar9 = vpblendvb_avx(auVar28,auVar4,auVar2);
      auVar16 = vpaddw_avx2(auVar12,auVar34);
      auVar16 = vpsubw_avx2(auVar16,auVar24);
      auVar22 = vpaddw_avx2(auVar22,auVar16);
      auVar22 = vpsrlw_avx2(auVar22,3);
      auVar4 = vpackuswb_avx(auVar22._0_16_,auVar22._16_16_);
      auVar4 = vpblendvb_avx(auVar3,auVar4,auVar2);
      auVar22 = vpsubw_avx2(auVar20,auVar13);
      auVar22 = vpaddw_avx2(auVar22,auVar19);
      auVar15 = vpaddw_avx2(auVar22,auVar15);
      auVar15 = vpsrlw_avx2(auVar15,3);
      auVar3 = vpackuswb_avx(auVar15._0_16_,auVar15._16_16_);
      auVar2 = vpblendvb_avx(auVar8,auVar3,auVar2);
      *(undefined1 (*) [16])(s + lVar14 * -3) = auVar4;
      *(undefined1 (*) [16])(s + lVar14 * -2) = auVar5;
      *(undefined1 (*) [16])(s + -lVar14) = auVar6;
      *(undefined1 (*) [16])s = auVar7;
      *(undefined1 (*) [16])(s + lVar14) = auVar9;
      *(undefined1 (*) [16])(s + lVar14 * 2) = auVar2;
      return;
    }
    *(undefined1 (*) [16])(s + lVar14 * -2) = auVar33 ^ auVar4;
    *(undefined1 (*) [16])(s + -lVar14) = auVar33 ^ auVar26;
    *(undefined1 (*) [16])s = auVar30 ^ auVar33;
    local_78 = auVar28._0_8_;
    uStack_70 = auVar28._8_8_;
    *(undefined8 *)(s + lVar14) = local_78;
    *(undefined8 *)(s + lVar14 + 8) = uStack_70;
  }
  return;
}

Assistant:

void aom_lpf_horizontal_8_quad_avx2(unsigned char *s, int p,
                                    const unsigned char *_blimit0,
                                    const unsigned char *_limit0,
                                    const unsigned char *_thresh0) {
  __m256i p256_3, q256_3, p256_2, q256_2, p256_1, q256_1, p256_0, q256_0;
  __m128i p3, p2, p1, p0, q0, q1, q2, q3;
  __m128i mask, flat;

  const __m128i thresh_v =
      _mm_broadcastb_epi8(_mm_cvtsi32_si128((int)_thresh0[0]));
  const __m128i limit_v =
      _mm_broadcastb_epi8(_mm_cvtsi32_si128((int)_limit0[0]));
  const __m128i blimit_v =
      _mm_broadcastb_epi8(_mm_cvtsi32_si128((int)_blimit0[0]));
  const __m128i zero = _mm_setzero_si128();
  const __m128i ff = _mm_cmpeq_epi8(zero, zero);

  p256_3 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 4 * p)));
  p256_2 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 3 * p)));
  p256_1 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 2 * p)));
  p256_0 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 1 * p)));
  q256_0 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s - 0 * p)));
  q256_1 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s + 1 * p)));
  q256_2 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s + 2 * p)));
  q256_3 =
      _mm256_castpd_si256(_mm256_broadcast_pd((__m128d const *)(s + 3 * p)));

  p3 = _mm256_castsi256_si128(p256_3);
  p2 = _mm256_castsi256_si128(p256_2);
  p1 = _mm256_castsi256_si128(p256_1);
  p0 = _mm256_castsi256_si128(p256_0);
  q0 = _mm256_castsi256_si128(q256_0);
  q1 = _mm256_castsi256_si128(q256_1);
  q2 = _mm256_castsi256_si128(q256_2);
  q3 = _mm256_castsi256_si128(q256_3);

  {
    __m128i work;
    const __m128i fe = _mm_set1_epi8((int8_t)0xfe);
    const __m128i abs_p1p0 =
        _mm_or_si128(_mm_subs_epu8(p1, p0), _mm_subs_epu8(p0, p1));
    const __m128i abs_q1q0 =
        _mm_or_si128(_mm_subs_epu8(q1, q0), _mm_subs_epu8(q0, q1));
    __m128i abs_p0q0 =
        _mm_or_si128(_mm_subs_epu8(p0, q0), _mm_subs_epu8(q0, p0));
    __m128i abs_p1q1 =
        _mm_or_si128(_mm_subs_epu8(p1, q1), _mm_subs_epu8(q1, p1));

    flat = _mm_max_epu8(abs_p1p0, abs_q1q0);

    abs_p0q0 = _mm_adds_epu8(abs_p0q0, abs_p0q0);
    abs_p1q1 = _mm_srli_epi16(_mm_and_si128(abs_p1q1, fe), 1);
    mask = _mm_subs_epu8(_mm_adds_epu8(abs_p0q0, abs_p1q1), blimit_v);
    mask = _mm_xor_si128(_mm_cmpeq_epi8(mask, zero), ff);
    // mask |= (abs(p0 - q0) * 2 + abs(p1 - q1) / 2  > blimit) * -1;
    mask = _mm_max_epu8(flat, mask);
    // mask |= (abs(p1 - p0) > limit) * -1;
    // mask |= (abs(q1 - q0) > limit) * -1;
    work = _mm_max_epu8(
        _mm_or_si128(_mm_subs_epu8(p2, p1), _mm_subs_epu8(p1, p2)),
        _mm_or_si128(_mm_subs_epu8(p3, p2), _mm_subs_epu8(p2, p3)));
    mask = _mm_max_epu8(work, mask);
    work = _mm_max_epu8(
        _mm_or_si128(_mm_subs_epu8(q2, q1), _mm_subs_epu8(q1, q2)),
        _mm_or_si128(_mm_subs_epu8(q3, q2), _mm_subs_epu8(q2, q3)));
    mask = _mm_max_epu8(work, mask);
    mask = _mm_subs_epu8(mask, limit_v);
    mask = _mm_cmpeq_epi8(mask, zero);
  }

  if (0xffff == _mm_movemask_epi8(_mm_cmpeq_epi8(mask, zero))) return;

  // loop filter
  {
    const __m128i t4 = _mm_set1_epi8(4);
    const __m128i t3 = _mm_set1_epi8(3);
    const __m128i t80 = _mm_set1_epi8((int8_t)0x80);
    const __m128i te0 = _mm_set1_epi8((int8_t)0xe0);
    const __m128i t1f = _mm_set1_epi8(0x1f);
    const __m128i t1 = _mm_set1_epi8(0x1);
    const __m128i t7f = _mm_set1_epi8(0x7f);
    const __m128i one = _mm_set1_epi8(1);
    __m128i hev;

    hev = _mm_subs_epu8(flat, thresh_v);
    hev = _mm_xor_si128(_mm_cmpeq_epi8(hev, zero), ff);

    __m128i ps1 = _mm_xor_si128(p1, t80);
    __m128i ps0 = _mm_xor_si128(p0, t80);
    __m128i qs0 = _mm_xor_si128(q0, t80);
    __m128i qs1 = _mm_xor_si128(q1, t80);
    __m128i filt;
    __m128i work_a;
    __m128i filter1, filter2;
    __m128i flat_p2, flat_p1, flat_p0, flat_q0, flat_q1, flat_q2;

    filt = _mm_and_si128(_mm_subs_epi8(ps1, qs1), hev);
    work_a = _mm_subs_epi8(qs0, ps0);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_adds_epi8(filt, work_a);
    filt = _mm_and_si128(filt, mask);

    filter1 = _mm_adds_epi8(filt, t4);
    filter2 = _mm_adds_epi8(filt, t3);

    work_a = _mm_cmpgt_epi8(zero, filter1);
    filter1 = _mm_srli_epi16(filter1, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter1 = _mm_and_si128(filter1, t1f);
    filter1 = _mm_or_si128(filter1, work_a);
    qs0 = _mm_xor_si128(_mm_subs_epi8(qs0, filter1), t80);

    work_a = _mm_cmpgt_epi8(zero, filter2);
    filter2 = _mm_srli_epi16(filter2, 3);
    work_a = _mm_and_si128(work_a, te0);
    filter2 = _mm_and_si128(filter2, t1f);
    filter2 = _mm_or_si128(filter2, work_a);
    ps0 = _mm_xor_si128(_mm_adds_epi8(ps0, filter2), t80);

    filt = _mm_adds_epi8(filter1, t1);
    work_a = _mm_cmpgt_epi8(zero, filt);
    filt = _mm_srli_epi16(filt, 1);
    work_a = _mm_and_si128(work_a, t80);
    filt = _mm_and_si128(filt, t7f);
    filt = _mm_or_si128(filt, work_a);
    filt = _mm_andnot_si128(hev, filt);
    ps1 = _mm_xor_si128(_mm_adds_epi8(ps1, filt), t80);
    qs1 = _mm_xor_si128(_mm_subs_epi8(qs1, filt), t80);

    __m128i work;
    work = _mm_max_epu8(
        _mm_or_si128(_mm_subs_epu8(p2, p0), _mm_subs_epu8(p0, p2)),
        _mm_or_si128(_mm_subs_epu8(q2, q0), _mm_subs_epu8(q0, q2)));
    flat = _mm_max_epu8(work, flat);
    work = _mm_max_epu8(
        _mm_or_si128(_mm_subs_epu8(p3, p0), _mm_subs_epu8(p0, p3)),
        _mm_or_si128(_mm_subs_epu8(q3, q0), _mm_subs_epu8(q0, q3)));
    flat = _mm_max_epu8(work, flat);
    flat = _mm_subs_epu8(flat, one);
    flat = _mm_cmpeq_epi8(flat, zero);
    flat = _mm_and_si128(flat, mask);

    if (0xffff != _mm_movemask_epi8(_mm_cmpeq_epi8(flat, zero))) {
      const __m256i four = _mm256_set1_epi16(4);
      __m256i pixetFilter_p2p1p0, p2p1p0, q2q1q0, pixetFilter_q2q1q0, sum_p,
          sum_q, res_p, res_q;

      const __m256i filter =
          _mm256_load_si256((__m256i const *)filt_loopfilter_avx2);

      p256_3 = _mm256_shuffle_epi8(p256_3, filter);
      p256_2 = _mm256_shuffle_epi8(p256_2, filter);
      p256_1 = _mm256_shuffle_epi8(p256_1, filter);
      p256_0 = _mm256_shuffle_epi8(p256_0, filter);
      q256_0 = _mm256_shuffle_epi8(q256_0, filter);
      q256_1 = _mm256_shuffle_epi8(q256_1, filter);
      q256_2 = _mm256_shuffle_epi8(q256_2, filter);
      q256_3 = _mm256_shuffle_epi8(q256_3, filter);

      p2p1p0 = _mm256_add_epi16(p256_0, _mm256_add_epi16(p256_2, p256_1));
      q2q1q0 = _mm256_add_epi16(q256_0, _mm256_add_epi16(q256_2, q256_1));

      pixetFilter_p2p1p0 =
          _mm256_add_epi16(four, _mm256_add_epi16(p2p1p0, q2q1q0));
      pixetFilter_q2q1q0 = pixetFilter_p2p1p0;

      pixetFilter_p2p1p0 = _mm256_add_epi16(pixetFilter_p2p1p0, p256_3);
      res_p =
          _mm256_srli_epi16(_mm256_add_epi16(pixetFilter_p2p1p0, p256_0), 3);
      flat_p0 = _mm256_castsi256_si128(
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res_p, res_p), 168));
      p0 = _mm_andnot_si128(flat, ps0);
      flat_p0 = _mm_and_si128(flat, flat_p0);
      p0 = _mm_or_si128(flat_p0, p0);

      pixetFilter_q2q1q0 = _mm256_add_epi16(pixetFilter_q2q1q0, q256_3);
      res_q =
          _mm256_srli_epi16(_mm256_add_epi16(pixetFilter_q2q1q0, q256_0), 3);
      flat_q0 = _mm256_castsi256_si128(
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res_q, res_q), 168));
      q0 = _mm_andnot_si128(flat, qs0);
      flat_q0 = _mm_and_si128(flat, flat_q0);
      q0 = _mm_or_si128(flat_q0, q0);

      sum_p = _mm256_sub_epi16(p256_3, q256_2);
      pixetFilter_p2p1p0 = _mm256_add_epi16(pixetFilter_p2p1p0, sum_p);
      res_p =
          _mm256_srli_epi16(_mm256_add_epi16(pixetFilter_p2p1p0, p256_1), 3);
      flat_p1 = _mm256_castsi256_si128(
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res_p, res_p), 168));
      p1 = _mm_andnot_si128(flat, ps1);
      flat_p1 = _mm_and_si128(flat, flat_p1);
      p1 = _mm_or_si128(flat_p1, p1);

      sum_q = _mm256_sub_epi16(q256_3, p256_2);
      pixetFilter_q2q1q0 = _mm256_add_epi16(pixetFilter_q2q1q0, sum_q);
      res_q =
          _mm256_srli_epi16(_mm256_add_epi16(pixetFilter_q2q1q0, q256_1), 3);
      flat_q1 = _mm256_castsi256_si128(
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res_q, res_q), 168));
      q1 = _mm_andnot_si128(flat, qs1);
      flat_q1 = _mm_and_si128(flat, flat_q1);
      q1 = _mm_or_si128(flat_q1, q1);

      sum_p = _mm256_sub_epi16(p256_3, q256_1);
      pixetFilter_p2p1p0 = _mm256_add_epi16(pixetFilter_p2p1p0, sum_p);
      res_p =
          _mm256_srli_epi16(_mm256_add_epi16(pixetFilter_p2p1p0, p256_2), 3);
      flat_p2 = _mm256_castsi256_si128(
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res_p, res_p), 168));
      p2 = _mm_andnot_si128(flat, p2);
      flat_p2 = _mm_and_si128(flat, flat_p2);
      p2 = _mm_or_si128(flat_p2, p2);

      sum_q = _mm256_sub_epi16(q256_3, p256_1);
      pixetFilter_q2q1q0 = _mm256_add_epi16(pixetFilter_q2q1q0, sum_q);
      res_q =
          _mm256_srli_epi16(_mm256_add_epi16(pixetFilter_q2q1q0, q256_2), 3);
      flat_q2 = _mm256_castsi256_si128(
          _mm256_permute4x64_epi64(_mm256_packus_epi16(res_q, res_q), 168));
      q2 = _mm_andnot_si128(flat, q2);
      flat_q2 = _mm_and_si128(flat, flat_q2);
      q2 = _mm_or_si128(flat_q2, q2);

      _mm_storeu_si128((__m128i *)(s - 3 * p), p2);
      _mm_storeu_si128((__m128i *)(s - 2 * p), p1);
      _mm_storeu_si128((__m128i *)(s - 1 * p), p0);
      _mm_storeu_si128((__m128i *)(s - 0 * p), q0);
      _mm_storeu_si128((__m128i *)(s + 1 * p), q1);
      _mm_storeu_si128((__m128i *)(s + 2 * p), q2);
    } else {
      _mm_storeu_si128((__m128i *)(s - 2 * p), ps1);
      _mm_storeu_si128((__m128i *)(s - 1 * p), ps0);
      _mm_storeu_si128((__m128i *)(s - 0 * p), qs0);
      _mm_storeu_si128((__m128i *)(s + 1 * p), qs1);
    }
  }
}